

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::AssertPred3Helper<bool(*)(int,int,int),int,int,int>
          (AssertionResult *__return_storage_ptr__,iutest *this,char *pred_str,char *expr1,
          char *expr2,char *expr3,_func_bool_int_int_int *pred,int val1,int val2,int val3)

{
  byte bVar1;
  AssertionResult *pAVar2;
  AssertionResult local_60;
  char *local_38;
  _func_bool_int_int_int *pred_local;
  char *expr3_local;
  char *expr2_local;
  char *expr1_local;
  char *pred_str_local;
  
  local_38 = expr3;
  pred_local = (_func_bool_int_int_int *)expr2;
  expr3_local = expr1;
  expr2_local = pred_str;
  expr1_local = (char *)this;
  pred_str_local = (char *)__return_storage_ptr__;
  bVar1 = (*(code *)expr3)((ulong)pred & 0xffffffff,val1,val2);
  if ((bVar1 & 1) == 0) {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_60,(char (*) [8])"error: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr1_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x5594b5);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr2_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x558aaa);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr3_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x558aaa);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&pred_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") evaluates to false, where ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x54ef55);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr2_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x54fe88);
    pAVar2 = AssertionResult::operator<<(pAVar2,(int *)&pred);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x54ef55);
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr3_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x54fe88);
    pAVar2 = AssertionResult::operator<<(pAVar2,&val1);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x54ef55);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&pred_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x54fe88);
    pAVar2 = AssertionResult::operator<<(pAVar2,&val2);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    AssertionResult::~AssertionResult(&local_60);
  }
  else {
    AssertionSuccess();
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult AssertPred3Helper(const char* pred_str
    , const char* expr1, const char* expr2, const char* expr3
    , PRED pred, T1 val1, T2 val2, T3 val3)
{
    if IUTEST_COND_LIKELY( (*pred)(val1, val2, val3) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "("
        << expr1 << ", " << expr2 << ", " << expr3
        << ") evaluates to false, where "
        << "\n" << expr1 << " : " << val1
        << "\n" << expr2 << " : " << val2
        << "\n" << expr3 << " : " << val3;
}